

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,ArrayPtr<const_char> *first,
          ArrayPtr<const_char> *rest,ArrayPtr<const_char> *rest_1,String *rest_2,
          ArrayPtr<const_char> *rest_3,StringTree *rest_4,StringTree *rest_5,StringTree *rest_6,
          ArrayPtr<const_char> *rest_7,ArrayPtr<const_char> *rest_8,ArrayPtr<const_char> *rest_9,
          String *rest_10,ArrayPtr<const_char> *rest_11,String *rest_12,
          ArrayPtr<const_char> *rest_13,ArrayPtr<const_char> *rest_14,ArrayPtr<const_char> *rest_15,
          StringTree *rest_16,ArrayPtr<const_char> *rest_17)

{
  size_t sVar1;
  
  sVar1 = first->size_;
  if (sVar1 != 0) {
    memcpy(pos,first->ptr,sVar1);
    pos = pos + sVar1;
  }
  sVar1 = rest->size_;
  if (sVar1 != 0) {
    memcpy(pos,rest->ptr,sVar1);
    pos = pos + sVar1;
  }
  sVar1 = rest_1->size_;
  if (sVar1 != 0) {
    memcpy(pos,rest_1->ptr,sVar1);
    pos = pos + sVar1;
  }
  fill<kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (this,pos,branchIndex,rest_2,rest_3,rest_4,rest_5,rest_6,rest_7,rest_8,rest_9,rest_10,
             rest_11,rest_12,rest_13,rest_14,rest_15,rest_16,rest_17);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, First&& first, Rest&&... rest) {
  pos = _::fill(pos, kj::fwd<First>(first));
  fill(pos, branchIndex, kj::fwd<Rest>(rest)...);
}